

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QtPrivate::argToQString
          (QString *__return_storage_ptr__,QtPrivate *this,QAnyStringView pattern,size_t numArgs,
          ArgBase **args)

{
  void *pvVar1;
  char cVar2;
  undefined1 **ppuVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 asize;
  char **ppcVar7;
  qsizetype percent;
  char **args_00;
  ulong uVar8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  char16_t *dst;
  char16_t *this_00;
  qsizetype size;
  long in_FS_OFFSET;
  QByteArrayView in;
  QAnyStringView string;
  qsizetype i;
  ArgIndexToPlaceholderMap result;
  ParseResult parts;
  QString local_3e0;
  QMessageLogger local_3c8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_3a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aStack_3a0;
  undefined1 **local_398;
  undefined1 *puStack_390;
  undefined1 *local_388;
  undefined1 *puStack_380;
  undefined1 *local_378;
  undefined1 *puStack_370;
  undefined1 *local_368;
  undefined1 *puStack_360;
  undefined1 *local_358;
  QVarLengthArray<(anonymous_namespace)::Part,_32LL> local_350;
  long local_38;
  
  asize = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)pattern.m_size;
  string.field_0 = pattern.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_350,0xaa,0x318);
  uVar8 = (ulong)string.field_0.m_data & 0x3fffffffffffffff;
  ppcVar7 = (char **)0x4000000000000000;
  if (((ulong)string.field_0.m_data & 0xc000000000000000) == 0x4000000000000000) {
    memset(&local_350,0xaa,0x318);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    lVar12 = 0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr =
         &local_350.super_QVLAStorage<24UL,_8UL,_32LL>;
    lVar10 = 0;
    if (1 < uVar8) {
      lVar10 = 0;
      lVar12 = 0;
      do {
        if (this[lVar10] == (QtPrivate)0x25) {
          local_3c8.context._0_8_ = lVar10;
          iVar4 = getEscape<char>((char *)this,(qsizetype *)&local_3c8,uVar8);
          if (iVar4 != -1) {
            if (lVar10 - lVar12 != 0) {
              local_3a8.m_data = this + lVar12;
              aStack_3a0.m_data = (void *)(lVar10 - lVar12 | 0x4000000000000000);
              local_398 = (undefined1 **)CONCAT44(local_398._4_4_,0xffffffff);
              QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                        (&local_350,(Part *)&local_3a8);
            }
            lVar12 = local_3c8.context._0_8_;
            local_3a8.m_data = this + lVar10;
            ppcVar7 = (char **)(lVar12 - lVar10 | 0x4000000000000000);
            local_398 = (undefined1 **)CONCAT44(local_398._4_4_,iVar4);
            aStack_3a0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)ppcVar7;
            local_3c8.context._0_8_ = lVar12;
            QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                      (&local_350,(Part *)&local_3a8);
          }
          lVar10 = local_3c8.context._0_8_;
          if (iVar4 == -1) goto LAB_00338652;
        }
        else {
LAB_00338652:
          lVar10 = lVar10 + 1;
        }
      } while (lVar10 < (long)(uVar8 - 1));
    }
    local_3c8.context._0_8_ = lVar10;
    if (uVar8 - lVar12 != 0 && lVar12 <= (long)uVar8) {
      local_3a8.m_data = this + lVar12;
      aStack_3a0.m_data = (void *)(uVar8 - lVar12 | 0x4000000000000000);
      local_398 = (undefined1 **)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  else {
    memset(&local_350,0xaa,0x318);
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a = 0x20;
    lVar12 = 0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s = 0;
    local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr =
         &local_350.super_QVLAStorage<24UL,_8UL,_32LL>;
    lVar10 = 0;
    if (1 < uVar8) {
      lVar10 = 0;
      lVar12 = 0;
      do {
        if (this[lVar10] == (QtPrivate)0x25) {
          local_3c8.context._0_8_ = lVar10;
          iVar4 = getEscape<char>((char *)this,(qsizetype *)&local_3c8,uVar8);
          if (iVar4 != -1) {
            aStack_3a0.m_data = (void *)(lVar10 - lVar12);
            if (aStack_3a0.m_data != (void *)0x0) {
              local_3a8.m_data = this + lVar12;
              local_398 = (undefined1 **)CONCAT44(local_398._4_4_,0xffffffff);
              QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                        (&local_350,(Part *)&local_3a8);
            }
            lVar12 = local_3c8.context._0_8_;
            local_3a8.m_data = this + lVar10;
            ppcVar7 = (char **)(lVar12 - lVar10);
            local_398 = (undefined1 **)CONCAT44(local_398._4_4_,iVar4);
            aStack_3a0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)ppcVar7;
            local_3c8.context._0_8_ = lVar12;
            QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back
                      (&local_350,(Part *)&local_3a8);
          }
          lVar10 = local_3c8.context._0_8_;
          if (iVar4 == -1) goto LAB_0033875e;
        }
        else {
LAB_0033875e:
          lVar10 = lVar10 + 1;
        }
      } while (lVar10 < (long)(uVar8 - 1));
    }
    aStack_3a0.m_data = (void *)(uVar8 - lVar12);
    local_3c8.context._0_8_ = lVar10;
    if (aStack_3a0.m_data != (void *)0x0 && lVar12 <= (long)uVar8) {
      local_3a8.m_data = this + lVar12;
      local_398 = (undefined1 **)CONCAT44(local_398._4_4_,0xffffffff);
      QVarLengthArray<(anonymous_namespace)::Part,_32LL>::push_back(&local_350,(Part *)&local_3a8);
    }
  }
  puStack_390 = &DAT_aaaaaaaaaaaaaaaa;
  local_358 = &DAT_aaaaaaaaaaaaaaaa;
  local_368 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_360 = &DAT_aaaaaaaaaaaaaaaa;
  local_378 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_370 = &DAT_aaaaaaaaaaaaaaaa;
  local_388 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_380 = &DAT_aaaaaaaaaaaaaaaa;
  local_3a8 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)0x10;
  aStack_3a0.m_data = (void *)0x0;
  local_398 = &puStack_390;
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s != 0) {
    lVar10 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    args_00 = (char **)((char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.
                                super_QVLABaseBase.ptr + 0x10);
    lVar12 = local_3c8.context._0_8_;
    do {
      local_3c8.context.line = (int)((ulong)lVar12 >> 0x20);
      local_3c8.context.version = *(int *)args_00;
      if (-1 < local_3c8.context.version) {
        if (aStack_3a0.m_data == local_3a8.m_data) {
          ppcVar7 = (char **)&local_3c8;
          QVLABase<int>::emplace_back_impl<int>
                    ((QVLABase<int> *)&local_3a8,0x10,&puStack_390,(int *)&local_3c8);
          lVar12 = CONCAT44(local_3c8.context.line,local_3c8.context.version);
        }
        else {
          ppcVar7 = args_00;
          local_3c8.context._0_8_ = lVar12;
          QVLABase<int>::emplace_back_impl<int_const&>
                    ((QVLABase<int> *)&local_3a8,0x10,&puStack_390,(int *)args_00);
          lVar12 = local_3c8.context._0_8_;
        }
      }
      local_3c8.context._0_8_ = lVar12;
      args_00 = args_00 + 3;
      lVar10 = lVar10 + -0x18;
      lVar12 = local_3c8.context._0_8_;
    } while (lVar10 != 0);
  }
  ppuVar3 = local_398;
  if (aStack_3a0.m_data != (void *)0x0) {
    pvVar1 = (void *)((long)local_398 + (long)aStack_3a0.m_data * 4);
    lVar10 = 0x3f;
    if (aStack_3a0.m_data != (void *)0x0) {
      for (; (ulong)aStack_3a0.m_data >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_398,pvVar1,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(ppuVar3,pvVar1);
  }
  piVar5 = std::__unique<int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (local_398,(void *)((long)local_398 + (long)aStack_3a0.m_data * 4));
  QVLABase<int>::erase
            ((QVLABase<int> *)&local_3a8,piVar5,
             (const_iterator)((long)aStack_3a0.m_data * 4 + (long)local_398));
  aVar9 = aStack_3a0;
  if (asize.m_data < aStack_3a0.m_data) {
    aVar9 = local_3a8;
    if ((long)local_3a8.m_data <= (long)asize.m_data) {
      aVar9 = asize;
    }
    QVLABase<int>::reallocate_impl
              ((QVLABase<int> *)&local_3a8,0x10,&puStack_390,(qsizetype)asize,(qsizetype)aVar9);
    aStack_3a0 = asize;
  }
  else if (aStack_3a0.m_data < asize.m_data) {
    local_3c8.context.version = 2;
    local_3c8.context.line = 0;
    local_3c8.context.file._0_4_ = 0;
    local_3c8.context._12_8_ = 0;
    local_3c8.context.function._4_4_ = 0;
    local_3c8.context.category = "default";
    string.m_size = (size_t)ppcVar7;
    convertToQString(&local_3e0,this,string);
    if (local_3e0.d.d == (Data *)0x0) {
      QString::reallocData(&local_3e0,local_3e0.d.size,KeepSize);
    }
    QMessageLogger::warning
              (&local_3c8,"QString::arg: %d argument(s) missing in %ls",
               (ulong)(uint)((int)pattern.m_size - aVar9._0_4_),local_3e0.d.ptr);
    argToQString((QtPrivate *)&local_3e0);
  }
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s == 0) {
    size = 0;
  }
  else {
    pcVar11 = (char *)local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr +
              0x10;
    lVar10 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    size = 0;
    do {
      if (*(int *)pcVar11 != -1) {
        piVar5 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_398,(void *)((long)local_398 + (long)aStack_3a0.m_data * 4),
                            pcVar11);
        if (piVar5 != (int *)((long)local_398 + (long)aStack_3a0.m_data * 4)) {
          pcVar6 = *(char **)(numArgs + ((long)piVar5 - (long)local_398) * 2);
          cVar2 = *pcVar6;
          if (cVar2 == '\x02') {
            uVar8 = *(ulong *)(pcVar6 + 8) | 0x8000000000000000;
LAB_003389c9:
            pcVar6 = pcVar6 + 0x10;
          }
          else {
            if (cVar2 != '\x01') {
              if (cVar2 != '\0') goto LAB_003389da;
              uVar8 = *(ulong *)(pcVar6 + 8) | 0x4000000000000000;
              goto LAB_003389c9;
            }
            uVar8 = *(ulong *)(pcVar6 + 0x10);
            pcVar6 = pcVar6 + 8;
          }
          *(undefined8 *)((QVLAStorage<24UL,_8UL,_32LL> *)(pcVar11 + -0x10))->array =
               *(undefined8 *)pcVar6;
          *(ulong *)(pcVar11 + -8) = uVar8;
        }
      }
LAB_003389da:
      size = size + (*(ulong *)(pcVar11 + -8) & 0x3fffffffffffffff);
      pcVar11 = pcVar11 + 0x18;
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != 0);
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,size,Uninitialized);
  pvVar1 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr;
  this_00 = (__return_storage_ptr__->d).ptr;
  if ((QUtf8 *)this_00 == (QUtf8 *)0x0) {
    this_00 = L"";
  }
  if (local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s != 0) {
    lVar10 = local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.s * 0x18;
    lVar12 = 0;
    do {
      uVar8 = *(ulong *)((char *)pvVar1 + lVar12 + 8);
      if ((uVar8 & 0xc000000000000000) == 0x4000000000000000) {
        if ((uVar8 & 0x3fffffffffffffff) != 0) {
          qt_from_latin1(this_00,*(char **)((char *)pvVar1 + lVar12),uVar8 & 0x3fffffffffffffff);
        }
        this_00 = (char16_t *)((long)this_00 + (uVar8 & 0x3fffffffffffffff) * 2);
      }
      else {
        in.m_data = (storage_type *)0x4000000000000000;
        in.m_size = *(qsizetype *)((char *)pvVar1 + lVar12);
        this_00 = QUtf8::convertToUnicode
                            ((QUtf8 *)this_00,(char16_t *)(uVar8 & 0x3fffffffffffffff),in);
      }
      lVar12 = lVar12 + 0x18;
    } while (lVar10 != lVar12);
  }
  lVar10 = (long)this_00 - (long)(__return_storage_ptr__->d).ptr >> 1;
  if (lVar10 < (__return_storage_ptr__->d).size) {
    QString::resize(__return_storage_ptr__,lVar10);
  }
  if (local_398 != &puStack_390) {
    sizedFree(local_398,(long)local_3a8.m_data << 2);
  }
  if ((QVLAStorage<24UL,_8UL,_32LL> *)
      local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr !=
      &local_350.super_QVLAStorage<24UL,_8UL,_32LL>) {
    sizedFree(local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.ptr,
              local_350.super_QVLABase<(anonymous_namespace)::Part>.super_QVLABaseBase.a * 0x18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QtPrivate::argToQString(QAnyStringView pattern, size_t numArgs, const ArgBase **args)
{
    // Step 1-2 above
    ParseResult parts = parseMultiArgFormatString(pattern);

    // 3-4
    ArgIndexToPlaceholderMap argIndexToPlaceholderMap = makeArgIndexToPlaceholderMap(parts);

    if (static_cast<size_t>(argIndexToPlaceholderMap.size()) > numArgs) // 3a
        argIndexToPlaceholderMap.resize(qsizetype(numArgs));
    else if (Q_UNLIKELY(static_cast<size_t>(argIndexToPlaceholderMap.size()) < numArgs)) // 3b
        qWarning("QString::arg: %d argument(s) missing in %ls",
                 int(numArgs - argIndexToPlaceholderMap.size()), qUtf16Printable(pattern.toString()));

    // 5
    const qsizetype totalSize = resolveStringRefsAndReturnTotalSize(parts, argIndexToPlaceholderMap, args);

    // 6:
    QString result(totalSize, Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData());

    struct Concatenate {
        QChar *out;
        QChar *operator()(QLatin1String part) noexcept
        {
            if (part.size()) {
                qt_from_latin1(reinterpret_cast<char16_t*>(out),
                               part.data(), part.size());
            }
            return out + part.size();
        }
        QChar *operator()(QUtf8StringView part) noexcept
        {
            return QUtf8::convertToUnicode(out, part);
        }
        QChar *operator()(QStringView part) noexcept
        {
            if (part.size())
                memcpy(out, part.data(), part.size() * sizeof(QChar));
            return out + part.size();
        }
    };

    for (const Part &part : parts)
        out = part.string.visit(Concatenate{out});

    // UTF-8 decoding may have caused an overestimate of totalSize - correct it:
    result.truncate(out - result.cbegin());

    return result;
}